

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join6.c
# Opt level: O1

int run_test_udp_multicast_join6(void)

{
  int iVar1;
  int extraout_EAX;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 unaff_RBX;
  undefined7 uVar4;
  code *pcVar5;
  uv_udp_t *puVar6;
  char *pcVar7;
  short *psVar8;
  uv_udp_send_t *puVar9;
  uv_udp_send_t *puVar10;
  uv_udp_send_t *puVar11;
  int in_R8D;
  bool bVar12;
  sockaddr_in6 addr;
  undefined1 auStack_c0 [16];
  undefined1 auStack_ac [28];
  code *pcStack_90;
  undefined1 auStack_88 [64];
  code *pcStack_48;
  code *pcStack_40;
  int local_34;
  void *local_30;
  
  pcStack_40 = (code *)0x188e66;
  iVar1 = uv_interface_addresses(&stack0xffffffffffffffd0,&local_34);
  if (iVar1 != 0) {
LAB_0018902b:
    pcStack_40 = (code *)0x189030;
    run_test_udp_multicast_join6_cold_17();
    return 1;
  }
  if ((long)local_34 < 1) {
    pcStack_40 = (code *)0x18902b;
    uv_free_interface_addresses();
    goto LAB_0018902b;
  }
  psVar8 = (short *)((long)local_30 + 0x14);
  uVar2 = 1;
  do {
    uVar4 = (undefined7)((ulong)unaff_RBX >> 8);
    unaff_RBX = CONCAT71(uVar4,1);
    if (*psVar8 == 10) {
      unaff_RBX = CONCAT71(uVar4,*(int *)(psVar8 + -2) != 0);
    }
    if ((char)unaff_RBX == '\0') break;
    psVar8 = psVar8 + 0x28;
    bVar12 = uVar2 < (ulong)(long)local_34;
    uVar2 = uVar2 + 1;
  } while (bVar12);
  pcStack_40 = (code *)0x188eb7;
  uv_free_interface_addresses(local_30);
  if ((char)unaff_RBX != '\0') goto LAB_0018902b;
  puVar9 = (uv_udp_send_t *)0x198bfb;
  pcVar5 = (code *)0x23a3;
  pcStack_40 = (code *)0x188ed5;
  iVar1 = uv_ip6_addr("::",0x23a3,&stack0xffffffffffffffd0);
  if (iVar1 == 0) {
    pcStack_40 = (code *)0x188ee2;
    puVar9 = (uv_udp_send_t *)uv_default_loop();
    puVar6 = &server;
    pcStack_40 = (code *)0x188ef1;
    iVar1 = uv_udp_init();
    pcVar5 = (code *)puVar6;
    if (iVar1 != 0) goto LAB_00189084;
    pcStack_40 = (code *)0x188efe;
    puVar9 = (uv_udp_send_t *)uv_default_loop();
    puVar6 = &client;
    pcStack_40 = (code *)0x188f0d;
    iVar1 = uv_udp_init();
    pcVar5 = (code *)puVar6;
    if (iVar1 != 0) goto LAB_00189089;
    puVar6 = &server;
    pcVar5 = (code *)&stack0xffffffffffffffd0;
    pcStack_40 = (code *)0x188f28;
    iVar1 = uv_udp_bind(&server,pcVar5,0);
    puVar9 = (uv_udp_send_t *)puVar6;
    if (iVar1 != 0) goto LAB_0018908e;
    puVar6 = &server;
    pcVar7 = "ff02::1";
    pcStack_40 = (code *)0x188f4a;
    iVar1 = uv_udp_set_membership(&server,"ff02::1",0,1);
    if (iVar1 == 0) {
      puVar6 = &server;
      pcVar5 = alloc_cb;
      pcStack_40 = (code *)0x188f6c;
      iVar1 = uv_udp_recv_start(&server,alloc_cb,cl_recv_cb);
      puVar9 = (uv_udp_send_t *)puVar6;
      if (iVar1 != 0) goto LAB_00189098;
      puVar9 = &req;
      pcStack_40 = (code *)0x188f80;
      iVar1 = do_send(&req);
      if (iVar1 != 0) goto LAB_0018909d;
      if (close_cb_called != 0) goto LAB_001890a2;
      if (cl_recv_cb_called != 0) goto LAB_001890a7;
      if (sv_send_cb_called != 0) goto LAB_001890ac;
      pcStack_40 = (code *)0x188fb4;
      puVar9 = (uv_udp_send_t *)uv_default_loop();
      pcVar5 = (code *)0x0;
      pcStack_40 = (code *)0x188fbe;
      uv_run();
      if (cl_recv_cb_called != 2) goto LAB_001890b1;
      if (sv_send_cb_called != 2) goto LAB_001890b6;
      if (close_cb_called != 2) goto LAB_001890bb;
      pcStack_40 = (code *)0x188fea;
      uVar3 = uv_default_loop();
      unaff_RBX = 0;
      pcStack_40 = (code *)0x189000;
      uv_walk(uVar3,close_walk_cb,0);
      pcVar5 = (code *)0x0;
      pcStack_40 = (code *)0x18900a;
      uv_run(uVar3);
      pcStack_40 = (code *)0x18900f;
      puVar9 = (uv_udp_send_t *)uv_default_loop();
      pcStack_40 = (code *)0x189017;
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        pcStack_40 = (code *)0x189024;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001890c0;
    }
    pcVar5 = (code *)pcVar7;
    puVar9 = (uv_udp_send_t *)puVar6;
    if (iVar1 != -0x13) goto LAB_00189093;
    pcStack_40 = (code *)0x18903c;
    unaff_RBX = uv_default_loop();
    pcStack_40 = (code *)0x189050;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcVar5 = (code *)0x0;
    pcStack_40 = (code *)0x18905a;
    uv_run(unaff_RBX);
    pcStack_40 = (code *)0x18905f;
    puVar9 = (uv_udp_send_t *)uv_default_loop();
    pcStack_40 = (code *)0x189067;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      pcStack_40 = (code *)0x189070;
      run_test_udp_multicast_join6_cold_15();
      return 1;
    }
  }
  else {
    pcStack_40 = (code *)0x189084;
    run_test_udp_multicast_join6_cold_1();
LAB_00189084:
    pcStack_40 = (code *)0x189089;
    run_test_udp_multicast_join6_cold_2();
LAB_00189089:
    pcStack_40 = (code *)0x18908e;
    run_test_udp_multicast_join6_cold_3();
LAB_0018908e:
    pcStack_40 = (code *)0x189093;
    run_test_udp_multicast_join6_cold_4();
LAB_00189093:
    pcStack_40 = (code *)0x189098;
    run_test_udp_multicast_join6_cold_16();
LAB_00189098:
    pcStack_40 = (code *)0x18909d;
    run_test_udp_multicast_join6_cold_5();
LAB_0018909d:
    pcStack_40 = (code *)0x1890a2;
    run_test_udp_multicast_join6_cold_6();
LAB_001890a2:
    pcStack_40 = (code *)0x1890a7;
    run_test_udp_multicast_join6_cold_7();
LAB_001890a7:
    pcStack_40 = (code *)0x1890ac;
    run_test_udp_multicast_join6_cold_8();
LAB_001890ac:
    pcStack_40 = (code *)0x1890b1;
    run_test_udp_multicast_join6_cold_9();
LAB_001890b1:
    pcStack_40 = (code *)0x1890b6;
    run_test_udp_multicast_join6_cold_10();
LAB_001890b6:
    pcStack_40 = (code *)0x1890bb;
    run_test_udp_multicast_join6_cold_11();
LAB_001890bb:
    pcStack_40 = (code *)0x1890c0;
    run_test_udp_multicast_join6_cold_12();
LAB_001890c0:
    pcStack_40 = (code *)0x1890c5;
    run_test_udp_multicast_join6_cold_13();
  }
  pcStack_40 = alloc_cb;
  run_test_udp_multicast_join6_cold_14();
  puVar11 = (uv_udp_send_t *)
            CONCAT71(0x56f6,puVar9 == (uv_udp_send_t *)&client || puVar9 == (uv_udp_send_t *)&server
                    );
  if (puVar9 == (uv_udp_send_t *)&client || puVar9 == (uv_udp_send_t *)&server) {
    if (pcVar5 < (uv_udp_t *)0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      return extraout_EAX;
    }
  }
  else {
    pcStack_48 = (code *)0x18910b;
    alloc_cb_cold_1();
  }
  pcStack_48 = cl_recv_cb;
  alloc_cb_cold_2();
  bVar12 = puVar9 == (uv_udp_send_t *)&server;
  puVar10 = (uv_udp_send_t *)(ulong)(puVar9 == (uv_udp_send_t *)&client || bVar12);
  if (puVar9 == (uv_udp_send_t *)&client || bVar12) {
    if (in_R8D != 0) goto LAB_00189210;
    if ((long)pcVar5 < 0) goto LAB_00189215;
    if ((uv_udp_t *)pcVar5 != (uv_udp_t *)0x0) {
      if (puVar11 == (uv_udp_send_t *)0x0) goto LAB_0018921a;
      if ((uv_udp_t *)pcVar5 != (uv_udp_t *)0x4) goto LAB_0018921f;
      if (*(int *)*extraout_RDX_00 == 0x474e4950) {
        cl_recv_cb_called = cl_recv_cb_called + 1;
        if (cl_recv_cb_called == 2) {
          iVar1 = uv_close(&server,close_cb);
          return iVar1;
        }
        goto LAB_001891a5;
      }
      goto LAB_00189224;
    }
    if (puVar11 == (uv_udp_send_t *)0x0) {
      return (int)CONCAT71(0x56f5,bVar12);
    }
    pcStack_90 = (code *)0x1891a5;
    cl_recv_cb_cold_10();
LAB_001891a5:
    pcStack_90 = (code *)0x1891b5;
    iVar1 = uv_ip6_name(puVar11,auStack_88,0x40);
    if (iVar1 != 0) goto LAB_00189229;
    puVar6 = &server;
    pcStack_90 = (code *)0x1891d0;
    iVar1 = uv_udp_set_membership(&server,"ff02::1",0,0);
    puVar11 = (uv_udp_send_t *)puVar6;
    if (iVar1 != 0) goto LAB_0018922e;
    puVar6 = &server;
    pcStack_90 = (code *)0x1891f2;
    iVar1 = uv_udp_set_source_membership(&server,"ff02::1",0,auStack_88,1);
    puVar11 = (uv_udp_send_t *)puVar6;
    if (iVar1 == 0) {
      puVar11 = &req_ss;
      pcStack_90 = (code *)0x189202;
      iVar1 = do_send(&req_ss);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00189238;
    }
  }
  else {
    pcStack_90 = (code *)0x189210;
    cl_recv_cb_cold_1();
LAB_00189210:
    pcStack_90 = (code *)0x189215;
    cl_recv_cb_cold_2();
LAB_00189215:
    pcStack_90 = (code *)0x18921a;
    cl_recv_cb_cold_11();
LAB_0018921a:
    pcStack_90 = (code *)0x18921f;
    cl_recv_cb_cold_9();
LAB_0018921f:
    pcStack_90 = (code *)0x189224;
    cl_recv_cb_cold_3();
LAB_00189224:
    puVar11 = puVar10;
    pcStack_90 = (code *)0x189229;
    cl_recv_cb_cold_4();
LAB_00189229:
    pcStack_90 = (code *)0x18922e;
    cl_recv_cb_cold_5();
LAB_0018922e:
    pcStack_90 = (code *)0x189233;
    cl_recv_cb_cold_6();
  }
  pcStack_90 = (code *)0x189238;
  cl_recv_cb_cold_7();
LAB_00189238:
  pcStack_90 = do_send;
  cl_recv_cb_cold_8();
  pcStack_90 = (code *)unaff_RBX;
  auStack_c0 = uv_buf_init("PING",4);
  pcVar7 = "ff02::1";
  iVar1 = uv_ip6_addr("ff02::1",0x23a3,auStack_ac);
  if (iVar1 == 0) {
    iVar1 = uv_udp_send(puVar11,&client,auStack_c0,1,auStack_ac,sv_send_cb);
    return iVar1;
  }
  do_send_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(pcVar7,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_multicast_join6) {
  int r;
  struct sockaddr_in6 addr;

  if (!can_ipv6_external())
    RETURN_SKIP("No external IPv6 interface available");

  ASSERT(0 == uv_ip6_addr("::", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  /* bind to the desired port */
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_set_membership(&server, MULTICAST_ADDR, INTERFACE_ADDR, UV_JOIN_GROUP);
  if (r == UV_ENODEV) {
    MAKE_VALGRIND_HAPPY();
    RETURN_SKIP("No ipv6 multicast route");
  }

  ASSERT(r == 0);

/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
  r = uv_udp_recv_start(&server, alloc_cb, cl_recv_cb);
  ASSERT(r == 0);
  
  r = do_send(&req);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_recv_cb_called == 2);
  ASSERT(sv_send_cb_called == 2);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}